

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>_>
* __thiscall
Lib::
IterTraits<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
::flatMap<Inferences::InductionContextFn>
          (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>_>
           *__return_storage_ptr__,
          IterTraits<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
          *this,InductionContextFn f)

{
  MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>
  *it;
  FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  *i;
  Literal *in_R8;
  InductionContextFn f_00;
  VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  local_50;
  MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>
  local_48;
  FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  local_30;
  
  f_00._premise = (Clause *)f._lit;
  local_50._core = (this->_iter)._core;
  if (local_50._core !=
      (IteratorCore<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       *)0x0) {
    (local_50._core)->_refCnt = (local_50._core)->_refCnt + 1;
  }
  f_00._lit = in_R8;
  getMappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>,Inferences::InductionContextFn>
            (&local_48,(Lib *)&local_50,
             (VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
              *)f._premise,f_00);
  getFlattenedIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>,Inferences::InductionContextFn,Lib::VirtualIterator<Inferences::InductionContext>>>
            (&local_30,(Lib *)&local_48,it);
  iterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term*,std::allocator<Kernel::Term*>>,Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>,Inferences::InductionContextFn,Lib::VirtualIterator<Inferences::InductionContext>>>>
            (__return_storage_ptr__,(Lib *)&local_30,i);
  FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  ::~FlatteningIterator(&local_30);
  VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  ::~VirtualIterator(&local_48._inner);
  VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  ::~VirtualIterator(&local_50);
  return __return_storage_ptr__;
}

Assistant:

IterTraits<FlatMapIter<Iter, F>> flatMap(F f)
  { return iterTraits(getFlattenedIterator(getMappingIterator(std::move(_iter), std::move(f)))); }